

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution1d.cpp
# Opt level: O1

void __thiscall
ncnn::Deconvolution1D::cut_padding
          (Deconvolution1D *this,Mat *top_blob_bordered,Mat *top_blob,Option *opt)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar2 = this->pad_left;
  if ((iVar2 < 1) && (iVar4 = this->pad_right, iVar4 < 1)) {
    if (this->output_w < 1) {
      if (top_blob == top_blob_bordered) {
        return;
      }
      piVar1 = top_blob_bordered->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = top_blob->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar1 = top_blob_bordered->refcount;
      top_blob->data = top_blob_bordered->data;
      top_blob->refcount = piVar1;
      top_blob->elemsize = top_blob_bordered->elemsize;
      top_blob->elempack = top_blob_bordered->elempack;
      top_blob->allocator = top_blob_bordered->allocator;
      iVar2 = top_blob_bordered->w;
      iVar4 = top_blob_bordered->h;
      iVar3 = top_blob_bordered->d;
      top_blob->dims = top_blob_bordered->dims;
      top_blob->w = iVar2;
      top_blob->h = iVar4;
      top_blob->d = iVar3;
      top_blob->c = top_blob_bordered->c;
      top_blob->cstep = top_blob_bordered->cstep;
      return;
    }
    iVar3 = top_blob_bordered->w - this->output_w;
    if (iVar2 == -0xe9 || iVar4 == -0xe9) {
      iVar2 = iVar3 / 2;
      iVar4 = iVar3 - iVar2;
    }
    else {
      if (iVar2 != -0xea && iVar4 != -0xea) {
        return;
      }
      iVar4 = iVar3 / 2;
      iVar2 = iVar3 - iVar4;
    }
  }
  else {
    iVar4 = this->pad_right;
  }
  copy_cut_border(top_blob_bordered,top_blob,0,0,iVar2,iVar4,opt);
  return;
}

Assistant:

void Deconvolution1D::cut_padding(const Mat& top_blob_bordered, Mat& top_blob, const Option& opt) const
{
    if (pad_left > 0 || pad_right > 0)
    {
        copy_cut_border(top_blob_bordered, top_blob, 0, 0, pad_left, pad_right, opt);
    }
    else if (output_w > 0)
    {
        int wcut = top_blob_bordered.w - output_w;

        if (pad_left == -233 || pad_right == -233)
        {
            // onnx padding=SAME_UPPER
            copy_cut_border(top_blob_bordered, top_blob, 0, 0, wcut / 2, wcut - wcut / 2, opt);
        }
        else if (pad_left == -234 || pad_right == -234)
        {
            // onnx padding=SAME_LOWER
            copy_cut_border(top_blob_bordered, top_blob, 0, 0, wcut - wcut / 2, wcut / 2, opt);
        }
    }
    else
    {
        top_blob = top_blob_bordered;
    }
}